

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaig.h
# Opt level: O0

void Mini_AigPush(Mini_Aig_t *p,int Lit0,int Lit1)

{
  int iVar1;
  int Lit1_local;
  int Lit0_local;
  Mini_Aig_t *p_local;
  
  if (p->nCap < p->nSize + 2) {
    if (p->nCap < 0xff) {
      Mini_AigGrow(p,0xff);
    }
    else {
      Mini_AigGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Lit0;
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Lit1;
  return;
}

Assistant:

static void Mini_AigPush( Mini_Aig_t * p, int Lit0, int Lit1 )
{
    if ( p->nSize + 2 > p->nCap )
    {
        if ( p->nCap < MINI_AIG_START_SIZE )
            Mini_AigGrow( p, MINI_AIG_START_SIZE );
        else
            Mini_AigGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Lit0;
    p->pArray[p->nSize++] = Lit1;
}